

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  ushort uVar1;
  uint uVar2;
  istream *piVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  double value;
  string buffer;
  istringstream is;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  string local_218;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  ValueHolder local_1d8;
  undefined4 local_1d0;
  CommentInfo *local_1c8;
  ptrdiff_t pStack_1c0;
  ptrdiff_t local_1b8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,token->start_,token->end_);
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_1f8,_S_in);
  piVar3 = std::istream::_M_extract<double>((double *)local_1b0);
  uVar2 = *(uint *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20);
  if ((uVar2 & 5) == 0) {
    uVar1 = *(ushort *)&decoded->field_0x8;
    *(ushort *)&decoded->field_0x8 = uVar1 & 0xff00 | 3;
    local_1d8 = decoded->value_;
    (decoded->value_).int_ = 0;
    *(ushort *)&decoded->field_0x8 = uVar1 & 0xfe00 | 3;
    local_1d0 = CONCAT22((short)((uint)local_1d0 >> 0x10),
                         uVar1 & 0x100 | uVar1 & 0xff | (ushort)local_1d0 & 0xfe00);
    local_1c8 = decoded->comments_;
    decoded->comments_ = (CommentInfo *)0x0;
    pStack_1c0 = decoded->start_;
    decoded->start_ = 0;
    local_1b8 = decoded->limit_;
    decoded->limit_ = 0;
    Value::~Value((Value *)&local_1d8);
  }
  else {
    local_258[0] = local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,token->start_,token->end_);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_258,0,(char *)0x0,0x1222a7);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_228 = *plVar5;
      lStack_220 = plVar4[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *plVar5;
      local_238 = (long *)*plVar4;
    }
    local_230 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_218.field_2._M_allocated_capacity = *psVar6;
      local_218.field_2._8_8_ = plVar4[3];
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    }
    else {
      local_218.field_2._M_allocated_capacity = *psVar6;
      local_218._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_218._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    addError(this,&local_218,token,(Location)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238);
    }
    if (local_258[0] != local_248) {
      operator_delete(local_258[0]);
    }
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0]);
  }
  return (uVar2 & 5) == 0;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  JSONCPP_STRING buffer(token.start_, token.end_);
  JSONCPP_ISTRINGSTREAM is(buffer);
  if (!(is >> value))
    return addError("'" + JSONCPP_STRING(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}